

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * mi_arena_try_alloc_at
                 (mi_arena_t *arena,size_t arena_index,size_t needed_bcount,_Bool commit,
                 mi_memid_t *memid)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  byte in_CL;
  size_t in_RDX;
  long in_RDI;
  mi_stat_count_t *in_R8;
  size_t already_committed_1;
  _Bool commit_zero;
  size_t stat_commit_size;
  size_t commit_size;
  size_t already_committed;
  size_t *in_stack_00000038;
  _Bool any_uncommitted;
  _Bool *in_stack_00000040;
  size_t in_stack_00000048;
  mi_bitmap_t in_stack_00000050;
  void *p;
  mi_bitmap_index_t bitmap_index;
  size_t in_stack_ffffffffffffff68;
  mi_arena_t *in_stack_ffffffffffffff70;
  mi_stat_count_t *stat;
  mi_bitmap_index_t *in_stack_ffffffffffffff78;
  size_t sVar4;
  undefined4 in_stack_ffffffffffffff80;
  mi_arena_id_t in_stack_ffffffffffffff84;
  uint uVar5;
  mi_arena_t *in_stack_ffffffffffffff88;
  void *addr;
  byte local_59;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  void *local_8;
  
  _Var1 = mi_arena_try_claim(in_stack_ffffffffffffff88,
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
  if (_Var1) {
    local_8 = mi_arena_block_start(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    stat = in_R8;
    mi_memid_create_arena
              (in_stack_ffffffffffffff84,SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0),
               (mi_bitmap_index_t)in_stack_ffffffffffffff78);
    stat->total = local_58;
    stat->peak = local_50;
    stat->current = local_48;
    *(byte *)&in_R8->current = *(byte *)(in_RDI + 0x18) & 1;
    if (*(long *)(in_RDI + 0xa8) != 0) {
      _mi_bitmap_unclaim_across
                (in_stack_00000050,in_stack_00000048,(size_t)in_stack_00000040,
                 (mi_bitmap_index_t)in_stack_00000038);
    }
    if (((*(byte *)(in_RDI + 0x1a) & 1) != 0) && (*(long *)(in_RDI + 0x98) != 0)) {
      _Var1 = _mi_bitmap_claim_across
                        ((mi_bitmap_t)bitmap_index,(size_t)p,(size_t)in_stack_00000050,
                         in_stack_00000048,in_stack_00000040,in_stack_00000038);
      *(_Bool *)((long)&in_R8->current + 2) = _Var1;
    }
    if (*(long *)(in_RDI + 0xa0) == 0) {
      *(undefined1 *)((long)&in_R8->current + 1) = 1;
    }
    else if ((in_CL & 1) == 0) {
      sVar4 = 0;
      _Var1 = _mi_bitmap_is_claimed_across
                        ((mi_bitmap_t)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         0,(size_t)stat,in_stack_ffffffffffffff68,(size_t *)0xaf40d6);
      *(_Bool *)((long)&in_R8->current + 1) = _Var1;
      if (((in_R8->current & 0x100) == 0) && (sVar4 != 0)) {
        mi_arena_block_size(sVar4);
        _mi_stat_decrease(stat,in_stack_ffffffffffffff68);
        _mi_bitmap_unclaim_across
                  (in_stack_00000050,in_stack_00000048,(size_t)in_stack_00000040,
                   (mi_bitmap_index_t)in_stack_00000038);
      }
    }
    else {
      *(undefined1 *)((long)&in_R8->current + 1) = 1;
      addr = (void *)0x0;
      _mi_bitmap_claim_across
                ((mi_bitmap_t)bitmap_index,(size_t)p,(size_t)in_stack_00000050,in_stack_00000048,
                 in_stack_00000040,in_stack_00000038);
      if ((local_59 & 1) != 0) {
        sVar2 = mi_arena_block_size(in_RDX);
        sVar4 = sVar2;
        sVar3 = mi_arena_block_size((size_t)addr);
        uVar5 = 0;
        _Var1 = _mi_os_commit_ex(addr,sVar4,(_Bool *)(sVar2 - sVar3),
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) &
                                 0xffffffffffffff);
        if (_Var1) {
          if ((uVar5 & 0x1000000) != 0) {
            *(undefined1 *)((long)&in_R8->current + 2) = 1;
          }
        }
        else {
          *(undefined1 *)((long)&in_R8->current + 1) = 0;
        }
      }
    }
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static mi_decl_noinline void* mi_arena_try_alloc_at(mi_arena_t* arena, size_t arena_index, size_t needed_bcount,
                                                    bool commit, mi_memid_t* memid)
{
  MI_UNUSED(arena_index);
  mi_assert_internal(mi_arena_id_index(arena->id) == arena_index);

  mi_bitmap_index_t bitmap_index;
  if (!mi_arena_try_claim(arena, needed_bcount, &bitmap_index)) return NULL;

  // claimed it!
  void* p = mi_arena_block_start(arena, bitmap_index);
  *memid = mi_memid_create_arena(arena->id, arena->exclusive, bitmap_index);
  memid->is_pinned = arena->memid.is_pinned;

  // none of the claimed blocks should be scheduled for a decommit
  if (arena->blocks_purge != NULL) {
    // this is thread safe as a potential purge only decommits parts that are not yet claimed as used (in `blocks_inuse`).
    _mi_bitmap_unclaim_across(arena->blocks_purge, arena->field_count, needed_bcount, bitmap_index);
  }

  // set the dirty bits (todo: no need for an atomic op here?)
  if (arena->memid.initially_zero && arena->blocks_dirty != NULL) {
    memid->initially_zero = _mi_bitmap_claim_across(arena->blocks_dirty, arena->field_count, needed_bcount, bitmap_index, NULL, NULL);
  }

  // set commit state
  if (arena->blocks_committed == NULL) {
    // always committed
    memid->initially_committed = true;
  }
  else if (commit) {
    // commit requested, but the range may not be committed as a whole: ensure it is committed now
    memid->initially_committed = true;
    bool any_uncommitted;
    size_t already_committed = 0;
    _mi_bitmap_claim_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index, &any_uncommitted, &already_committed);
    if (any_uncommitted) {
      mi_assert_internal(already_committed < needed_bcount);
      const size_t commit_size = mi_arena_block_size(needed_bcount);
      const size_t stat_commit_size = commit_size - mi_arena_block_size(already_committed);
      bool commit_zero = false;
      if (!_mi_os_commit_ex(p, commit_size, &commit_zero, stat_commit_size)) {
        memid->initially_committed = false;
      }
      else {
        if (commit_zero) { memid->initially_zero = true; }
      }
    }
  }
  else {
    // no need to commit, but check if already fully committed
    size_t already_committed = 0;
    memid->initially_committed = _mi_bitmap_is_claimed_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index, &already_committed);
    if (!memid->initially_committed && already_committed > 0) {
      // partially committed: as it will be committed at some time, adjust the stats and pretend the range is fully uncommitted.
      mi_assert_internal(already_committed < needed_bcount);
      _mi_stat_decrease(&_mi_stats_main.committed, mi_arena_block_size(already_committed));
      _mi_bitmap_unclaim_across(arena->blocks_committed, arena->field_count, needed_bcount, bitmap_index);
    }
  }

  return p;
}